

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpheaders.c
# Opt level: O1

HTTP_HEADERS_HANDLE HTTPHeaders_Clone(HTTP_HEADERS_HANDLE handle)

{
  HTTP_HEADERS_HANDLE __ptr;
  MAP_HANDLE pMVar1;
  HTTP_HEADERS_HANDLE_DATA *handleData;
  
  if ((handle != (HTTP_HEADERS_HANDLE)0x0) &&
     (__ptr = (HTTP_HEADERS_HANDLE)malloc(8), __ptr != (HTTP_HEADERS_HANDLE)0x0)) {
    pMVar1 = Map_Clone(handle->headers);
    __ptr->headers = pMVar1;
    if (pMVar1 != (MAP_HANDLE)0x0) {
      return __ptr;
    }
    free(__ptr);
  }
  return (HTTP_HEADERS_HANDLE)0x0;
}

Assistant:

HTTP_HEADERS_HANDLE HTTPHeaders_Clone(HTTP_HEADERS_HANDLE handle)
{
    HTTP_HEADERS_HANDLE_DATA* result;
    /*Codes_SRS_HTTP_HEADERS_02_003: [If handle is NULL then HTTPHeaders_Clone shall return NULL.] */
    if (handle == NULL)
    {
        result = NULL;
    }
    else
    {
        /*Codes_SRS_HTTP_HEADERS_02_004: [Otherwise HTTPHeaders_Clone shall clone the content of handle to a new handle.] */
        result = (HTTP_HEADERS_HANDLE_DATA*)malloc(sizeof(HTTP_HEADERS_HANDLE_DATA));
        if (result == NULL)
        {
            /*Codes_SRS_HTTP_HEADERS_02_005: [If cloning fails for any reason, then HTTPHeaders_Clone shall return NULL.] */
        }
        else
        {
            HTTP_HEADERS_HANDLE_DATA* handleData = handle;
            result->headers = Map_Clone(handleData->headers);
            if (result->headers == NULL)
            {
                /*Codes_SRS_HTTP_HEADERS_02_005: [If cloning fails for any reason, then HTTPHeaders_Clone shall return NULL.] */
                free(result);
                result = NULL;
            }
            else
            {
                /*all is fine*/
            }
        }
    }
    return result;
}